

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O1

Real amrex::Amr::computeOptimalSubcycling
               (int n,int *best,Real *dt_max,Real *est_work,int *cycle_max)

{
  Real RVar1;
  Real RVar2;
  ulong uVar3;
  int i;
  int iVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  Real RVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  Real RVar14;
  vector<int,_std::allocator<int>_> cycles;
  allocator_type local_51;
  Real local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  uVar3 = (ulong)(uint)n;
  std::vector<int,_std::allocator<int>_>::vector(&local_48,(long)n,&local_51);
  iVar7 = 1;
  if (1 < n) {
    uVar5 = 1;
    do {
      iVar7 = iVar7 * cycle_max[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
  if (iVar7 < 1) {
    local_50 = 0.0;
  }
  else {
    RVar1 = *dt_max;
    RVar2 = *est_work;
    local_50 = 0.0;
    iVar8 = 0;
    dVar12 = 1e+200;
    do {
      *local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start = 1;
      RVar10 = RVar2;
      dVar13 = RVar1;
      if (1 < n) {
        iVar9 = *local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar5 = 1;
        RVar14 = RVar1;
        iVar4 = iVar8;
        do {
          iVar9 = iVar9 * (iVar4 % cycle_max[uVar5] + 1);
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar5] = iVar9;
          iVar4 = iVar4 / cycle_max[uVar5];
          dVar13 = dt_max[uVar5] * (double)iVar9;
          if (RVar14 <= dVar13) {
            dVar13 = RVar14;
          }
          RVar10 = RVar10 + (double)iVar9 * est_work[uVar5];
          uVar5 = uVar5 + 1;
          RVar14 = dVar13;
        } while (uVar3 != uVar5);
      }
      dVar11 = RVar10 / dVar13;
      if (dVar11 < dVar12) {
        local_50 = dVar13;
      }
      if (dVar11 < dVar12 && 0 < n) {
        uVar5 = 0;
        do {
          best[uVar5] = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar5];
          uVar5 = uVar5 + 1;
          local_50 = dVar13;
        } while (uVar3 != uVar5);
      }
      else if (dVar12 <= dVar11) {
        dVar11 = dVar12;
      }
      iVar8 = iVar8 + 1;
      dVar12 = dVar11;
    } while (iVar8 != iVar7);
  }
  if (1 < n) {
    lVar6 = uVar3 + 1;
    do {
      best[lVar6 + -2] = best[lVar6 + -2] / best[lVar6 + -3];
      lVar6 = lVar6 + -1;
    } while (2 < lVar6);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return local_50;
}

Assistant:

Real
Amr::computeOptimalSubcycling(int n, int* best, Real* dt_max, Real* est_work, int* cycle_max)
{
    BL_ASSERT(cycle_max[0] == 1);
    // internally these represent the total number of steps at a level,
    // not the number of cycles
    std::vector<int> cycles(n);
#ifdef AMREX_USE_FLOAT
    Real best_ratio = 1e30f;
#else
    Real best_ratio = 1e200;
#endif
    Real best_dt = 0;
    Real ratio;
    Real dt;
    Real work;
    int limit = 1;
    // This provides a memory efficient way to test all candidates
    for (int i = 1; i < n; i++)
        limit *= cycle_max[i];
    for (int candidate = 0; candidate < limit; candidate++)
    {
        int temp_cand = candidate;
        cycles[0] = 1;
        dt = dt_max[0];
        work = est_work[0];
        for (int i  = 1; i < n; i++)
        {
            // grab the relevant "digit" and shift over.
            cycles[i] = (1 + temp_cand%cycle_max[i]) * cycles[i-1];
            temp_cand /= cycle_max[i];
            dt = std::min(dt, cycles[i]*dt_max[i]);
            work += cycles[i]*est_work[i];
        }
        ratio = work/dt;
        if (ratio < best_ratio)
        {
            for (int i  = 0; i < n; i++)
                best[i] = cycles[i];
            best_ratio = ratio;
            best_dt = dt;
        }
    }
    //
    // Now we convert best back to n_cycles format
    //
    for (int i = n-1; i > 0; i--)
        best[i] /= best[i-1];
    return best_dt;
}